

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void AddWindowToDrawData(ImVector<ImDrawList_*> *out_render_list,ImGuiWindow *window)

{
  int *piVar1;
  ImGuiWindow *window_00;
  long lVar2;
  
  piVar1 = &(GImGui->IO).MetricsRenderWindows;
  *piVar1 = *piVar1 + 1;
  AddDrawListToDrawData(out_render_list,window->DrawList);
  if (0 < (window->DC).ChildWindows.Size) {
    lVar2 = 0;
    do {
      window_00 = (window->DC).ChildWindows.Data[lVar2];
      if ((window_00->Active == true) && (window_00->Hidden == false)) {
        AddWindowToDrawData(out_render_list,window_00);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < (window->DC).ChildWindows.Size);
  }
  return;
}

Assistant:

static void AddWindowToDrawData(ImVector<ImDrawList*>* out_render_list, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    g.IO.MetricsRenderWindows++;
    AddDrawListToDrawData(out_render_list, window->DrawList);
    for (int i = 0; i < window->DC.ChildWindows.Size; i++)
    {
        ImGuiWindow* child = window->DC.ChildWindows[i];
        if (IsWindowActiveAndVisible(child)) // clipped children may have been marked not active
            AddWindowToDrawData(out_render_list, child);
    }
}